

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<mp::expr::Kind>::Matcher(Matcher<mp::expr::Kind> *this,Kind value)

{
  EqMatcher<mp::expr::Kind> EVar1;
  Matcher<mp::expr::Kind> *in_RDI;
  undefined4 in_stack_ffffffffffffffc4;
  EqMatcher<mp::expr::Kind> *in_stack_ffffffffffffffe8;
  
  internal::MatcherBase<mp::expr::Kind>::MatcherBase((MatcherBase<mp::expr::Kind> *)0x19455b);
  (in_RDI->super_MatcherBase<mp::expr::Kind>)._vptr_MatcherBase =
       (_func_int **)&PTR__Matcher_0042a1f8;
  EVar1 = Eq<mp::expr::Kind>(0x194572);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffe8);
  operator=((Matcher<mp::expr::Kind> *)CONCAT44(in_stack_ffffffffffffffc4,EVar1.rhs_),in_RDI);
  ~Matcher((Matcher<mp::expr::Kind> *)0x1945ab);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }